

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

void __thiscall xmrig::Api::start(Api *this)

{
  Config *this_00;
  void *pvVar1;
  long in_RDI;
  Httpd *in_stack_00000028;
  Base *in_stack_ffffffffffffffe8;
  Api *in_stack_fffffffffffffff0;
  
  this_00 = Base::config(*(Base **)(in_RDI + 8));
  BaseConfig::apiWorkerId(&this_00->super_BaseConfig);
  genWorkerId(in_stack_fffffffffffffff0,(String *)in_stack_ffffffffffffffe8);
  pvVar1 = operator_new(0x30);
  Httpd::Httpd((Httpd *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  *(void **)(in_RDI + 0xb8) = pvVar1;
  Httpd::start(in_stack_00000028);
  return;
}

Assistant:

void xmrig::Api::start()
{
    genWorkerId(m_base->config()->apiWorkerId());

#   ifdef XMRIG_FEATURE_HTTP
    m_httpd = new Httpd(m_base);
    m_httpd->start();
#   endif
}